

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O0

bool __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess::operator()
          (SuffixNameLess *this,SuffixImpl *lhs,SuffixImpl *rhs)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s2;
  BasicStringRef<char> *in_RDX;
  BasicStringRef<char> *in_RSI;
  int cmp;
  size_t rhs_size;
  size_t lhs_size;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 local_1;
  
  sVar2 = fmt::BasicStringRef<char>::size(in_RSI);
  sVar3 = fmt::BasicStringRef<char>::size(in_RDX);
  if (sVar2 == sVar3) {
    __s2 = fmt::BasicStringRef<char>::data(in_RSI);
    fmt::BasicStringRef<char>::data(in_RDX);
    iVar1 = std::char_traits<char>::compare
                      ((char_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       __s2,in_stack_ffffffffffffffb8);
    local_1 = iVar1 < 0;
  }
  else {
    local_1 = sVar2 < sVar3;
  }
  return local_1;
}

Assistant:

bool operator()(const SuffixImpl &lhs, const SuffixImpl &rhs) const {
      std::size_t lhs_size = lhs.name.size(), rhs_size = rhs.name.size();
      if (lhs_size != rhs_size)
        return lhs_size < rhs_size;
      auto cmp = std::char_traits<char>::compare(
            lhs.name.data(), rhs.name.data(), lhs_size);
      return cmp<0;
      /// Don't compare kind_pure() because BasicProb
      /// has own suffix set for each kind
    }